

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.l.cpp
# Opt level: O0

void __thiscall deci_FlexLexer::yyunput(deci_FlexLexer *this,int c,char *yy_bp)

{
  int iVar1;
  char *local_40;
  char *source;
  char *dest;
  char *pcStack_28;
  int number_to_move;
  char *yy_cp;
  char *yy_bp_local;
  int c_local;
  deci_FlexLexer *this_local;
  
  pcStack_28 = this->yy_c_buf_p;
  *pcStack_28 = this->yy_hold_char;
  yy_cp = yy_bp;
  if (pcStack_28 < this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_ch_buf + 2) {
    local_40 = this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_ch_buf + (this->yy_n_chars + 2);
    source = this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_ch_buf +
             (this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_buf_size + 2);
    while (this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_ch_buf < local_40) {
      source[-1] = local_40[-1];
      local_40 = local_40 + -1;
      source = source + -1;
    }
    pcStack_28 = pcStack_28 + ((int)source - (int)local_40);
    yy_cp = yy_bp + ((int)source - (int)local_40);
    iVar1 = this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_buf_size;
    this->yy_n_chars = iVar1;
    this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_n_chars = iVar1;
    if (pcStack_28 < this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_ch_buf + 2) {
      (*(this->super_FlexLexer)._vptr_FlexLexer[0xe])(this,"flex scanner push-back overflow");
    }
  }
  pcStack_28[-1] = (char)c;
  if (c == 10) {
    (this->super_FlexLexer).yylineno = (this->super_FlexLexer).yylineno + -1;
  }
  (this->super_FlexLexer).yytext = yy_cp;
  this->yy_hold_char = pcStack_28[-1];
  this->yy_c_buf_p = pcStack_28 + -1;
  return;
}

Assistant:

void yyFlexLexer::yyunput( int c, char* yy_bp)
{
	char *yy_cp;
    
    yy_cp = (yy_c_buf_p);

	/* undo effects of setting up yytext */
	*yy_cp = (yy_hold_char);

	if ( yy_cp < YY_CURRENT_BUFFER_LVALUE->yy_ch_buf + 2 )
		{ /* need to shift things up to make room */
		/* +2 for EOB chars. */
		int number_to_move = (yy_n_chars) + 2;
		char *dest = &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[
					YY_CURRENT_BUFFER_LVALUE->yy_buf_size + 2];
		char *source =
				&YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[number_to_move];

		while ( source > YY_CURRENT_BUFFER_LVALUE->yy_ch_buf )
			*--dest = *--source;

		yy_cp += (int) (dest - source);
		yy_bp += (int) (dest - source);
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars =
			(yy_n_chars) = (int) YY_CURRENT_BUFFER_LVALUE->yy_buf_size;

		if ( yy_cp < YY_CURRENT_BUFFER_LVALUE->yy_ch_buf + 2 )
			YY_FATAL_ERROR( "flex scanner push-back overflow" );
		}

	*--yy_cp = (char) c;

    if ( c == '\n' ){
        --yylineno;
    }

	(yytext_ptr) = yy_bp;
	(yy_hold_char) = *yy_cp;
	(yy_c_buf_p) = yy_cp;
}